

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

level_type booster::log::logger::string_to_level(string *l)

{
  bool bVar1;
  level_type lVar2;
  invalid_argument *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  bVar1 = std::operator==(l,"emergency");
  lVar2 = emergency;
  if (!bVar1) {
    bVar1 = std::operator==(l,"alert");
    if (bVar1) {
      lVar2 = alert;
    }
    else {
      bVar1 = std::operator==(l,"critical");
      if (bVar1) {
        lVar2 = critical;
      }
      else {
        bVar1 = std::operator==(l,"error");
        if (bVar1) {
          lVar2 = error;
        }
        else {
          bVar1 = std::operator==(l,"warning");
          if (bVar1) {
            lVar2 = warning;
          }
          else {
            bVar1 = std::operator==(l,"notice");
            if (bVar1) {
              lVar2 = notice;
            }
            else {
              bVar1 = std::operator==(l,"info");
              if (bVar1) {
                lVar2 = info;
              }
              else {
                bVar1 = std::operator==(l,"debug");
                if (!bVar1) {
                  this = (invalid_argument *)__cxa_allocate_exception(0x30);
                  std::operator+(&bStack_38,"Invalig logging level :",l);
                  invalid_argument::invalid_argument(this,&bStack_38);
                  __cxa_throw(this,&invalid_argument::typeinfo,invalid_argument::~invalid_argument);
                }
                lVar2 = debug;
              }
            }
          }
        }
      }
    }
  }
  return lVar2;
}

Assistant:

level_type logger::string_to_level(std::string const &l)
	{
		if(l=="emergency") return emergency;
		if(l=="alert") return alert;
		if(l=="critical") return critical;
		if(l=="error") return error;
		if(l=="warning") return warning;
		if(l=="notice") return notice;
		if(l=="info") return info;
		if(l=="debug") return debug;
		throw booster::invalid_argument("Invalig logging level :" + l);
	}